

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

void __thiscall Editor::flipTile(Editor *this,bool acrossVertical)

{
  long in_RDI;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> pVar1;
  Board *in_stack_00000010;
  bool in_stack_0000002f;
  SubBoard *in_stack_00000030;
  unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> command_1;
  unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> command;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> bounds;
  Vector2i *in_stack_ffffffffffffff68;
  FlipTiles *in_stack_ffffffffffffff70;
  unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> *this_00;
  unique_ptr<Command,_std::default_delete<Command>_> *in_stack_ffffffffffffff78;
  Vector2i *first;
  Editor *in_stack_ffffffffffffff80;
  Editor *this_01;
  __uniq_ptr_impl<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_>
  in_stack_ffffffffffffff98;
  bool *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar2;
  Vector2i in_stack_ffffffffffffffb0;
  Drawable in_stack_ffffffffffffffb8;
  int local_1c;
  int local_14;
  
  if (*(int *)(in_RDI + 0x2d4) == 0) {
    if ((*(byte *)(in_RDI + 0x2d0) & 1) != 0) {
      pVar1 = Board::getHighlightedBounds(in_stack_00000010);
      local_1c = pVar1.first.x;
      local_14 = pVar1.second.x;
      if (local_14 < local_1c) {
        makeCommand<commands::FlipTiles,Board&,bool&,bool>
                  ((Editor *)in_stack_ffffffffffffffb8._vptr_Drawable,
                   (Board *)in_stack_ffffffffffffffb0,
                   (bool *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffa0);
        std::unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_>::operator->
                  ((unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> *)
                   0x1910b8);
        commands::FlipTiles::pushBackTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        this_01 = (Editor *)&stack0xffffffffffffffb8;
        std::unique_ptr<Command,std::default_delete<Command>>::
        unique_ptr<commands::FlipTiles,std::default_delete<commands::FlipTiles>,void>
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)this_01,
                   (unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> *)
                   in_stack_ffffffffffffff78);
        executeCommand(this_01,in_stack_ffffffffffffff78);
        std::unique_ptr<Command,_std::default_delete<Command>_>::~unique_ptr
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)this_01);
        std::unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_>::~unique_ptr
                  ((unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> *)
                   in_stack_ffffffffffffff70);
      }
      else {
        uVar2 = 1;
        first = (Vector2i *)&stack0xffffffffffffffb0;
        makeCommand<commands::FlipTiles,Board&,bool&,bool>
                  ((Editor *)in_stack_ffffffffffffffb8._vptr_Drawable,
                   (Board *)in_stack_ffffffffffffffb0,(bool *)CONCAT17(1,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffa0);
        (anonymous_namespace)::forEachTile<Editor::flipTile(bool)::__0>
                  ((Board *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),first,
                   (Vector2i *)
                   in_stack_ffffffffffffff98._M_t.
                   super__Tuple_impl<0UL,_commands::FlipTiles_*,_std::default_delete<commands::FlipTiles>_>
                   .super__Head_base<0UL,_commands::FlipTiles_*,_false>._M_head_impl,
                   (anon_class_8_1_bc00122b)in_stack_ffffffffffffffb0);
        this_00 = (unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> *)
                  &stack0xffffffffffffff98;
        std::unique_ptr<Command,std::default_delete<Command>>::
        unique_ptr<commands::FlipTiles,std::default_delete<commands::FlipTiles>,void>
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)in_stack_ffffffffffffff80,
                   (unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> *)
                   first);
        executeCommand(in_stack_ffffffffffffff80,
                       (unique_ptr<Command,_std::default_delete<Command>_> *)first);
        std::unique_ptr<Command,_std::default_delete<Command>_>::~unique_ptr
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)in_stack_ffffffffffffff80);
        std::unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_>::~unique_ptr
                  (this_00);
      }
    }
  }
  else if (*(int *)(in_RDI + 0x2d4) == 1) {
    SubBoard::flip(in_stack_00000030,in_stack_0000002f);
  }
  else if (*(int *)(in_RDI + 0x2d4) == 2) {
    SubBoard::flip(in_stack_00000030,in_stack_0000002f);
  }
  return;
}

Assistant:

void Editor::flipTile(bool acrossVertical) {
    if (cursorState_ == CursorState::empty) {
        if (!cursorCoords_.second) {
            return;
        }
        auto bounds = board_.getHighlightedBounds();
        if (bounds.first.x > bounds.second.x) {
            // Not flipping a selection.
            auto command = makeCommand<commands::FlipTiles>(board_, acrossVertical, false);
            command->pushBackTile(cursorCoords_.first);
            executeCommand(std::move(command));
        } else {
            // Flipping a selection.
            auto command = makeCommand<commands::FlipTiles>(board_, acrossVertical, true);
            forEachTile(board_, bounds.first, bounds.second, [&command](Chunk& chunk, int i, int x, int y) {
                Tile tile = chunk.accessTile(i);
                if (tile.getHighlight()) {
                    command->pushBackTile({x, y});
                }
            });
            executeCommand(std::move(command));
        }
    } else if (cursorState_ == CursorState::pickTile) {
        tileSubBoard_.flip(acrossVertical);
    } else if (cursorState_ == CursorState::pasteArea) {
        copySubBoard_.flip(acrossVertical);
    }
}